

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O3

bool rtosc::
     validate<2,irqus::typestring<(char)115,(char)101,(char)110,(char)100,(char)45,(char)116,(char)111>>
               (char *arg)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  
  bVar3 = false;
  pcVar2 = rtosc_match_path("send-to",arg,(char **)0x0);
  if (pcVar2 != (char *)0x0) {
    uVar1 = rtosc_narguments(arg);
    bVar3 = uVar1 == 2;
  }
  return bVar3;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}